

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.c
# Opt level: O1

char * glfwGetGamepadName(int jid)

{
  ulong uVar1;
  GLFWbool GVar2;
  int iVar3;
  _GLFWmapping *p_Var4;
  
  if (_glfw.initialized == 0) {
    p_Var4 = (_GLFWmapping *)0x0;
    _glfwInputError(0x10001,(char *)0x0);
  }
  else {
    uVar1 = (ulong)(uint)jid;
    if ((uint)jid < 0x10) {
      GVar2 = initJoysticks();
      if ((GVar2 == 0) || (_glfw.joysticks[uVar1].present == 0)) {
        p_Var4 = (_GLFWmapping *)0x0;
      }
      else {
        p_Var4 = (_GLFWmapping *)0x0;
        iVar3 = _glfwPlatformPollJoystick(_glfw.joysticks + uVar1,0);
        if (iVar3 != 0) {
          p_Var4 = _glfw.joysticks[uVar1].mapping;
        }
      }
    }
    else {
      p_Var4 = (_GLFWmapping *)0x0;
      _glfwInputError(0x10003,"Invalid joystick ID %i",uVar1);
    }
  }
  return p_Var4->name;
}

Assistant:

GLFWAPI const char* glfwGetGamepadName(int jid)
{
    _GLFWjoystick* js;

    assert(jid >= GLFW_JOYSTICK_1);
    assert(jid <= GLFW_JOYSTICK_LAST);

    _GLFW_REQUIRE_INIT_OR_RETURN(NULL);

    if (jid < 0 || jid > GLFW_JOYSTICK_LAST)
    {
        _glfwInputError(GLFW_INVALID_ENUM, "Invalid joystick ID %i", jid);
        return NULL;
    }

    if (!initJoysticks())
        return NULL;

    js = _glfw.joysticks + jid;
    if (!js->present)
        return NULL;

    if (!_glfwPlatformPollJoystick(js, _GLFW_POLL_PRESENCE))
        return NULL;

    if (!js->mapping)
        return NULL;

    return js->mapping->name;
}